

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryBuffer.cpp
# Opt level: O0

void CopyStringRef(char *Memory,StringRef Data)

{
  size_t __n;
  char *Memory_local;
  StringRef Data_local;
  
  __n = Data.Length;
  if (__n != 0) {
    memcpy(Memory,Data.Data,__n);
  }
  Memory[__n] = '\0';
  return;
}

Assistant:

static void CopyStringRef(char *Memory, StringRef Data) {
  if (!Data.empty())
    memcpy(Memory, Data.data(), Data.size());
  Memory[Data.size()] = 0; // Null terminate string.
}